

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

void __thiscall QByteArray::reallocData(QByteArray *this,qsizetype alloc,AllocationOption option)

{
  Data *pDVar1;
  char *pcVar2;
  char *pcVar3;
  size_t __n;
  long in_FS_OFFSET;
  pair<QTypedArrayData<char>_*,_char_*> local_38;
  size_t local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (alloc == 0) {
    local_38 = (pair<QTypedArrayData<char>_*,_char_*>)(ZEXT816(0x129698) << 0x40);
    local_28 = 0;
    QArrayDataPointer<char>::operator=(&this->d,(QArrayDataPointer<char> *)&local_38);
  }
  else {
    pDVar1 = (this->d).d;
    if (((pDVar1 != (Data *)0x0) &&
        (pcVar3 = (this->d).ptr,
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) &&
       (pcVar2 = (char *)((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0
                         ), pcVar3 == pcVar2 || (long)pcVar3 - (long)pcVar2 < 0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QtPrivate::QPodArrayOps<char>::reallocate((QPodArrayOps<char> *)this,alloc,option);
        return;
      }
      goto LAB_00115622;
    }
    __n = (this->d).size;
    if (alloc <= (long)__n) {
      __n = alloc;
    }
    local_38 = QTypedArrayData<char>::allocate(alloc,option);
    pcVar3 = local_38.second;
    local_28 = __n;
    if (0 < (long)__n) {
      memcpy(pcVar3,(this->d).ptr,__n);
    }
    pcVar3[__n] = '\0';
    QArrayDataPointer<char>::operator=(&this->d,(QArrayDataPointer<char> *)&local_38);
  }
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_00115622:
  __stack_chk_fail();
}

Assistant:

void QByteArray::reallocData(qsizetype alloc, QArrayData::AllocationOption option)
{
    if (!alloc) {
        d = DataPointer::fromRawData(&_empty, 0);
        return;
    }

    // don't use reallocate path when reducing capacity and there's free space
    // at the beginning: might shift data pointer outside of allocated space
    const bool cannotUseReallocate = d.freeSpaceAtBegin() > 0;

    if (d->needsDetach() || cannotUseReallocate) {
        DataPointer dd(alloc, qMin(alloc, d.size), option);
        Q_CHECK_PTR(dd.data());
        if (dd.size > 0)
            ::memcpy(dd.data(), d.data(), dd.size);
        dd.data()[dd.size] = 0;
        d = dd;
    } else {
        d->reallocate(alloc, option);
    }
}